

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::AnonymousProgramSyntax::AnonymousProgramSyntax
          (AnonymousProgramSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token keyword,Token semi,
          SyntaxList<slang::syntax::MemberSyntax> *members,Token endkeyword)

{
  size_t sVar1;
  pointer ppAVar2;
  pointer ppMVar3;
  SyntaxNode *pSVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  
  uVar6 = keyword._0_8_;
  uVar7 = semi._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = AnonymousProgram;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar5 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f8690;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_002f85e0;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar8 = 0;
    do {
      *(AnonymousProgramSyntax **)(*(long *)((long)ppAVar2 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  (this->keyword).kind = (short)uVar6;
  (this->keyword).field_0x2 = (char)((ulong)uVar6 >> 0x10);
  (this->keyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar6 >> 0x18);
  (this->keyword).rawLen = (int)((ulong)uVar6 >> 0x20);
  (this->keyword).info = keyword.info;
  (this->semi).kind = (short)uVar7;
  (this->semi).field_0x2 = (char)((ulong)uVar7 >> 0x10);
  (this->semi).numFlags = (NumericTokenFlags)(char)((ulong)uVar7 >> 0x18);
  (this->semi).rawLen = (int)((ulong)uVar7 >> 0x20);
  (this->semi).info = semi.info;
  uVar5 = *(undefined4 *)&(members->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar4 = (members->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->members).super_SyntaxListBase.super_SyntaxNode.kind =
       (members->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar4;
  (this->members).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (members->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f8690;
  (this->members).super_SyntaxListBase.childCount = (members->super_SyntaxListBase).childCount;
  sVar1 = (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
       (members->super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->members).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f86d0;
  (this->endkeyword).kind = endkeyword.kind;
  (this->endkeyword).field_0x2 = endkeyword._2_1_;
  (this->endkeyword).numFlags = (NumericTokenFlags)endkeyword.numFlags.raw;
  (this->endkeyword).rawLen = endkeyword.rawLen;
  (this->endkeyword).info = endkeyword.info;
  (this->members).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppMVar3 = (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              _M_ptr;
    lVar8 = 0;
    do {
      *(AnonymousProgramSyntax **)(*(long *)((long)ppMVar3 + lVar8) + 8) = this;
      lVar8 = lVar8 + 8;
    } while (sVar1 << 3 != lVar8);
  }
  return;
}

Assistant:

AnonymousProgramSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token keyword, Token semi, const SyntaxList<MemberSyntax>& members, Token endkeyword) :
        MemberSyntax(SyntaxKind::AnonymousProgram, attributes), keyword(keyword), semi(semi), members(members), endkeyword(endkeyword) {
        this->members.parent = this;
        for (auto child : this->members)
            child->parent = this;
    }